

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::RenderDeviceGLImpl::CreateBufferFromGLHandle
          (RenderDeviceGLImpl *this,Uint32 GLHandle,BufferDesc *BuffDesc,RESOURCE_STATE InitialState
          ,IBuffer **ppBuffer)

{
  anon_class_48_6_215cb50b ConstructObject;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pDeviceContext;
  string msg;
  undefined1 local_71;
  RefCntWeakPtr<Diligent::DeviceContextGLImpl> local_70;
  string local_60;
  undefined1 *local_40;
  IBuffer ***pppIStack_38;
  RefCountersImpl *local_30;
  IBuffer **local_28;
  
  local_70.m_pObject._4_4_ = GLHandle;
  if (GLHandle == 0) {
    FormatString<char[34]>(&local_60,(char (*) [34])"GL buffer handle must not be null");
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"CreateBufferFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
               ,0x175);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_70.m_pRefCounters = (RefCountersImpl *)0x0;
  }
  else {
    RefCntWeakPtr<Diligent::DeviceContextGLImpl>::Lock(&local_70);
    if (local_70.m_pRefCounters != (RefCountersImpl *)0x0) goto LAB_002e4d0d;
  }
  FormatString<char[44]>(&local_60,(char (*) [44])"Immediate device context has been destroyed");
  DebugAssertionFailed
            (local_60._M_dataplus._M_p,"CreateBufferFromGLHandle",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
             ,0x178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
LAB_002e4d0d:
  local_30 = local_70.m_pRefCounters + 0x27;
  local_60.field_2._M_allocated_capacity = (size_type)&local_30;
  local_40 = &local_71;
  local_71 = 0;
  pppIStack_38 = &local_28;
  local_60.field_2._8_8_ = (long)&local_70.m_pObject + 4;
  ConstructObject.BuffDesc = BuffDesc;
  ConstructObject.this = &this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>;
  ConstructObject.ExtraArgs =
       (reference_wrapper<Diligent::GLContextState> *)local_60.field_2._M_allocated_capacity;
  ConstructObject._24_8_ = local_60.field_2._8_8_;
  ConstructObject._32_8_ = local_40;
  ConstructObject.ppBuffer = pppIStack_38;
  local_60._M_dataplus._M_p = (pointer)this;
  local_60._M_string_length = (size_type)BuffDesc;
  local_28 = ppBuffer;
  RenderDeviceBase<Diligent::EngineGLImplTraits>::
  CreateDeviceObject<Diligent::IBuffer,Diligent::BufferDesc,Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::CreateBufferImpl<std::reference_wrapper<Diligent::GLContextState>,unsigned_int,bool>(Diligent::IBuffer**,Diligent::BufferDesc_const&,std::reference_wrapper<Diligent::GLContextState>const&,unsigned_int_const&,bool_const&)::_lambda()_1_>
            (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,"Buffer",BuffDesc,ppBuffer,
             ConstructObject);
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::Release
            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)&local_70);
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateBufferFromGLHandle(Uint32 GLHandle, const BufferDesc& BuffDesc, RESOURCE_STATE InitialState, IBuffer** ppBuffer)
{
    DEV_CHECK_ERR(GLHandle != 0, "GL buffer handle must not be null");

    auto pDeviceContext = GetImmediateContext(0);
    VERIFY(pDeviceContext, "Immediate device context has been destroyed");
    CreateBufferImpl(ppBuffer, BuffDesc, std::ref(pDeviceContext->GetContextState()), GLHandle, /*bIsDeviceInternal =*/false);
}